

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::Matches(Element *this,String *selectors)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  iterator __begin1;
  pointer ppSVar4;
  StyleSheetNodeListRaw leaf_nodes;
  String local_148;
  StyleSheetNode root_node;
  
  StyleSheetNode::StyleSheetNode(&root_node);
  StyleSheetParser::ConstructNodes(&leaf_nodes,&root_node,selectors);
  ppSVar4 = leaf_nodes.
            super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      leaf_nodes.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_148,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_148._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_148);
    bVar3 = false;
  }
  else {
    do {
      bVar3 = ppSVar4 !=
              leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
      if (ppSVar4 ==
          leaf_nodes.
          super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
      bVar2 = StyleSheetNode::IsApplicable(*ppSVar4,this,this);
      ppSVar4 = ppSVar4 + 1;
    } while (!bVar2);
  }
  ::std::_Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>::~_Vector_base
            (&leaf_nodes.
              super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>);
  StyleSheetNode::~StyleSheetNode(&root_node);
  return bVar3;
}

Assistant:

bool Element::Matches(const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return false;
	}

	for (const StyleSheetNode* node : leaf_nodes)
	{
		if (node->IsApplicable(this, this))
		{
			return true;
		}
	}

	return false;
}